

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O0

void __thiscall
CCheckQueue<FakeCheckCheckCompletion>::~CCheckQueue(CCheckQueue<FakeCheckCheckCompletion> *this)

{
  long lVar1;
  bool bVar2;
  vector<std::thread,_std::allocator<std::thread>_> *in_RDI;
  long in_FS_OFFSET;
  thread *t;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  iterator __end2;
  iterator __begin2;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffb8;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffffb8);
  ~CCheckQueue::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffc8);
  std::condition_variable::notify_all();
  std::vector<std::thread,_std::allocator<std::thread>_>::begin(in_RDI);
  std::vector<std::thread,_std::allocator<std::thread>_>::end(in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                      ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_stack_ffffffffffffffc8,
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffc8 =
         (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
         __gnu_cxx::
         __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
         operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                    *)in_stack_ffffffffffffffb8);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)in_stack_ffffffffffffffb8);
  }
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(in_stack_ffffffffffffffb8);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffffc8);
  std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::~vector
            (in_stack_ffffffffffffffc8);
  std::condition_variable::~condition_variable
            ((condition_variable *)
             &in_RDI[3].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::condition_variable::~condition_variable
            ((condition_variable *)
             &in_RDI[1].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCheckQueue()
    {
        WITH_LOCK(m_mutex, m_request_stop = true);
        m_worker_cv.notify_all();
        for (std::thread& t : m_worker_threads) {
            t.join();
        }
    }